

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildMessage(google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,google::protobuf::Descriptor*,google::protobuf::internal::FlatAllocator&)::__5,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  string_view format;
  Arg *in_stack_ffffffffffffff10;
  Arg local_e8;
  Arg local_b8;
  Arg local_88;
  Arg local_58;
  
  substitute_internal::Arg::Arg(&local_58,*(int *)**(undefined8 **)this);
  substitute_internal::Arg::Arg(&local_88,*(int *)(**(long **)this + 4) + -1);
  substitute_internal::Arg::Arg(&local_b8,*(int *)**(undefined8 **)(this + 8));
  substitute_internal::Arg::Arg(&local_e8,*(int *)(**(long **)(this + 8) + 4) + -1);
  format._M_str = (char *)&local_58;
  format._M_len = (size_t)"Extension range $0 to $1 overlaps with reserved range $2 to $3.";
  Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)0x3f,format,&local_88,&local_b8,&local_e8,
             in_stack_ffffffffffffff10);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}